

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O3

VkImageMemoryBarrier * __thiscall
myvk::ImageBase::GetMemoryBarrier
          (VkImageMemoryBarrier *__return_storage_ptr__,ImageBase *this,
          VkImageSubresourceLayers *region,VkAccessFlags src_access_mask,
          VkAccessFlags dst_access_mask,VkImageLayout old_layout,VkImageLayout new_layout,
          uint32_t src_queue_family,uint32_t dst_queue_family)

{
  uint32_t uVar1;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->pNext = (void *)0x0;
  (__return_storage_ptr__->subresourceRange).aspectMask = 0;
  (__return_storage_ptr__->subresourceRange).baseMipLevel = 0;
  (__return_storage_ptr__->subresourceRange).levelCount = 0;
  (__return_storage_ptr__->subresourceRange).baseArrayLayer = 0;
  __return_storage_ptr__->srcQueueFamilyIndex = 0;
  __return_storage_ptr__->dstQueueFamilyIndex = 0;
  __return_storage_ptr__->image = (VkImage)0x0;
  __return_storage_ptr__->srcAccessMask = 0;
  __return_storage_ptr__->dstAccessMask = 0;
  __return_storage_ptr__->oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  __return_storage_ptr__->newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  *(undefined8 *)&(__return_storage_ptr__->subresourceRange).layerCount = 0;
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  __return_storage_ptr__->image = this->m_image;
  __return_storage_ptr__->oldLayout = old_layout;
  __return_storage_ptr__->newLayout = new_layout;
  __return_storage_ptr__->srcAccessMask = src_access_mask;
  __return_storage_ptr__->dstAccessMask = dst_access_mask;
  __return_storage_ptr__->srcQueueFamilyIndex = src_queue_family;
  __return_storage_ptr__->dstQueueFamilyIndex = dst_queue_family;
  uVar1 = region->mipLevel;
  (__return_storage_ptr__->subresourceRange).aspectMask = region->aspectMask;
  (__return_storage_ptr__->subresourceRange).baseMipLevel = uVar1;
  (__return_storage_ptr__->subresourceRange).levelCount = 1;
  uVar1 = region->layerCount;
  (__return_storage_ptr__->subresourceRange).baseArrayLayer = region->baseArrayLayer;
  (__return_storage_ptr__->subresourceRange).layerCount = uVar1;
  return __return_storage_ptr__;
}

Assistant:

VkImageMemoryBarrier ImageBase::GetMemoryBarrier(const VkImageSubresourceLayers &region, VkAccessFlags src_access_mask,
                                                 VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                                 VkImageLayout new_layout, uint32_t src_queue_family,
                                                 uint32_t dst_queue_family) const {
	VkImageMemoryBarrier ret = {};
	ret.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
	ret.image = m_image;
	ret.oldLayout = old_layout;
	ret.newLayout = new_layout;
	ret.srcAccessMask = src_access_mask;
	ret.dstAccessMask = dst_access_mask;
	ret.srcQueueFamilyIndex = src_queue_family;
	ret.dstQueueFamilyIndex = dst_queue_family;
	VkImageSubresourceRange &range = ret.subresourceRange;
	range.aspectMask = region.aspectMask;
	range.baseMipLevel = region.mipLevel;
	range.levelCount = 1;
	range.baseArrayLayer = region.baseArrayLayer;
	range.layerCount = region.layerCount;
	return ret;
}